

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDate __thiscall QDate::addMonths(QDate *this,int nmonths,QCalendar cal)

{
  QDate date;
  bool bVar1;
  int iVar2;
  int iVar3;
  QDate QVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  YearMonthDay YVar9;
  QCalendar local_40;
  long local_38;
  ulong uVar8;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  date = (QDate)this->jd;
  QVar4.jd = -0x8000000000000000;
  local_40.d_ptr = cal.d_ptr;
  if ((date.jd + 0xb69eeff91fU < 0x16d3e147974) && (QVar4 = date, nmonths != 0)) {
    YVar9 = QCalendar::partsFromDate(&local_40,date);
    QVar4.jd = -0x8000000000000000;
    if (YVar9._0_8_ >> 0x20 != 0x80000000) {
      uVar7 = CONCAT44(YVar9.month + nmonths,YVar9.year);
LAB_0030c2fe:
      iVar3 = (int)(uVar7 >> 0x20);
      if (0 < iVar3) {
        uVar8 = uVar7;
        do {
          iVar3 = QCalendar::monthsInYear(&local_40,(int)uVar8);
          do {
            iVar2 = (int)(uVar7 >> 0x20);
            iVar5 = iVar2 - iVar3;
            if (iVar5 == 0 || iVar2 < iVar3) {
              YVar9.day = YVar9.day;
              YVar9.year = (int)uVar7;
              YVar9.month = (int)(uVar7 >> 0x20);
              QVar4 = fixedDate(YVar9,local_40);
              goto LAB_0030c394;
            }
            iVar3 = (int)uVar7;
            uVar7 = CONCAT44(iVar5,iVar3 + 1);
            uVar6 = iVar3 + 1;
            uVar8 = (ulong)uVar6;
            if (uVar6 != 0) break;
            bVar1 = QCalendar::hasYearZero(&local_40);
            iVar3 = 0;
          } while (!bVar1);
        } while( true );
      }
      iVar5 = (int)uVar7 + -1;
      if (iVar5 == 0) goto code_r0x0030c311;
      goto LAB_0030c320;
    }
  }
LAB_0030c394:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDate)QVar4.jd;
code_r0x0030c311:
  uVar7 = uVar7 & 0xffffffff00000000;
  bVar1 = QCalendar::hasYearZero(&local_40);
  if (bVar1) {
LAB_0030c320:
    iVar2 = QCalendar::monthsInYear(&local_40,iVar5);
    uVar7 = CONCAT44(iVar2 + iVar3,iVar5);
  }
  goto LAB_0030c2fe;
}

Assistant:

QDate QDate::addMonths(int nmonths, QCalendar cal) const
{
    if (!isValid())
        return QDate();

    if (nmonths == 0)
        return *this;

    auto parts = cal.partsFromDate(*this);

    if (!parts.isValid())
        return QDate();
    Q_ASSERT(parts.year || cal.hasYearZero());

    parts.month += nmonths;
    while (parts.month <= 0) {
        if (--parts.year || cal.hasYearZero())
            parts.month += cal.monthsInYear(parts.year);
    }
    int count = cal.monthsInYear(parts.year);
    while (parts.month > count) {
        parts.month -= count;
        count = (++parts.year || cal.hasYearZero()) ? cal.monthsInYear(parts.year) : 0;
    }

    return fixedDate(parts, cal);
}